

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
::HandleWaitingShaders
          (PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
           *this,bool WaitForCompletion)

{
  pointer ppSVar1;
  State SVar2;
  SHADER_STATUS SVar3;
  char (*in_RCX) [33];
  pointer ppSVar4;
  bool bVar5;
  string msg;
  
  if ((this->super_PipelineBuilderBase).m_State != WaitingShaders) {
    FormatString<char[26],char[33]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::WaitingShaders",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"HandleWaitingShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x158);
    std::__cxx11::string::~string((string *)&msg);
  }
  ppSVar4 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
  do {
    if (ppSVar4 == ppSVar1) {
      if (bVar5) {
        SVar2 = LinkingPrograms;
LAB_002bb9db:
        (this->super_PipelineBuilderBase).m_State = SVar2;
      }
      return;
    }
    SVar3 = ShaderGLImpl::GetStatus(*ppSVar4,WaitForCompletion);
    if (SVar3 == SHADER_STATUS_COMPILING) {
      bVar5 = false;
    }
    else if (SVar3 != SHADER_STATUS_READY) {
      if (SVar3 == SHADER_STATUS_FAILED) {
        SVar2 = Failed;
        goto LAB_002bb9db;
      }
      FormatString<char[25]>(&msg,(char (*) [25])"Unexpected shader status");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"HandleWaitingShaders",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0x16b);
      std::__cxx11::string::~string((string *)&msg);
    }
    ppSVar4 = ppSVar4 + 1;
  } while( true );
}

Assistant:

void HandleWaitingShaders(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::WaitingShaders);
        bool AllShaderReady = true;
        for (ShaderGLImpl* pShaderGL : m_Shaders)
        {
            SHADER_STATUS Status = pShaderGL->GetStatus(WaitForCompletion);
            switch (Status)
            {
                case SHADER_STATUS_COMPILING:
                    AllShaderReady = false;
                    break;

                case SHADER_STATUS_FAILED:
                    m_State = State::Failed;
                    return;

                case SHADER_STATUS_READY:
                    break;

                default:
                    UNEXPECTED("Unexpected shader status");
            }
        }

        if (AllShaderReady)
        {
            m_State = State::LinkingPrograms;
        }
    }